

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O0

void __thiscall Qclass::Qupdate(Qclass *this,int lastAction,int lastState,int x,int y,int new_state)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int reward;
  int new_state_local;
  int y_local;
  int x_local;
  int lastState_local;
  int lastAction_local;
  Qclass *this_local;
  
  this->learn_rate = 0.5;
  this->disc_rew = 0.8;
  iVar4 = rewardfunc(this,lastAction,x,y);
  if ((this->restart & 1U) == 1) {
    this->Q[lastState][lastAction] =
         (this->learn_rate * (double)iVar4 + this->Q[lastState][lastAction]) -
         this->Q[lastState][lastAction];
  }
  else {
    dVar1 = this->Q[lastState][lastAction];
    dVar2 = this->learn_rate;
    dVar3 = this->disc_rew;
    iVar5 = futurereward(this,new_state);
    this->Q[lastState][lastAction] =
         dVar2 * ((dVar3 * (double)iVar5 + (double)iVar4) - this->Q[lastState][lastAction]) + dVar1;
  }
  return;
}

Assistant:

void Qclass::Qupdate(int lastAction, int lastState, int x, int y,
                     int new_state) {
  Qclass::learn_rate = 0.5;
  Qclass::disc_rew = 0.8;
  int reward = Qclass::rewardfunc(lastAction, x, y);
  if (restart == true) {
    // Future Reward not taken into account in case of collisions
    Q[lastState][lastAction] = Q[lastState][lastAction] + learn_rate * (reward)
        - Q[lastState][lastAction];
  } else {
    Q[lastState][lastAction] = Q[lastState][lastAction]
        + learn_rate
            * (reward + (disc_rew * futurereward(new_state))
                - Q[lastState][lastAction]);
  }
}